

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_> *
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
init_leaf(btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          *n,btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
             *parent,int max_count)

{
  slot_type *m;
  int max_count_local;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *parent_local;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *n_local;
  
  set_parent(n,parent);
  set_position(n,'\0');
  set_start(n,'\0');
  set_count(n,'\0');
  set_max_count(n,(field_type)max_count);
  m = slot(n,0);
  absl::container_internal::SanitizerPoisonMemoryRegion(m,(long)max_count << 2);
  return n;
}

Assistant:

static btree_node *init_leaf(btree_node *n, btree_node *parent,
                               int max_count) {
    n->set_parent(parent);
    n->set_position(0);
    n->set_start(0);
    n->set_count(0);
    n->set_max_count(max_count);
    absl::container_internal::SanitizerPoisonMemoryRegion(
        n->slot(0), max_count * sizeof(slot_type));
    return n;
  }